

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_true> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
::binary_search_impl<std::__cxx11::string,phmap::priv::StringBtreeDefaultLess>
          (btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,phmap::Less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,true>>
           *this,string *k,int s,int e,StringBtreeDefaultLess *comp)

{
  SearchResult<int,_true> SVar1;
  bool bVar2;
  key_type *this_00;
  string_view sVar3;
  OnlyLiteralZero<std::nullptr_t> local_6c;
  value_type local_6b;
  OnlyLiteralZero<std::nullptr_t> local_6a;
  value_type local_69;
  string_view local_68;
  string_view local_58;
  value_type local_41;
  int local_40;
  weak_ordering c;
  int mid;
  MatchKind exact_match;
  StringBtreeDefaultLess *comp_local;
  int e_local;
  int s_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
  *this_local;
  undefined4 uStack_c;
  
  c.value_ = '\x01';
  comp_local._0_4_ = e;
  comp_local._4_4_ = s;
  while (comp_local._4_4_ != (int)comp_local) {
    local_40 = comp_local._4_4_ + (int)comp_local >> 1;
    this_00 = btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
              ::key((btree_node<phmap::priv::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_true>_>
                     *)this,(long)local_40);
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00)
    ;
    local_58 = sVar3;
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(k);
    local_68 = sVar3;
    local_69 = (value_type)StringBtreeDefaultLess::operator()(comp,&local_58,&local_68);
    local_41 = local_69;
    compare_internal::OnlyLiteralZero<std::nullptr_t>::OnlyLiteralZero(&local_6a,(void *)0x0);
    bVar2 = phmap::operator<(local_69);
    if (bVar2) {
      comp_local._4_4_ = local_40 + 1;
    }
    else {
      comp_local._0_4_ = local_40;
      local_6b = local_41;
      compare_internal::OnlyLiteralZero<std::nullptr_t>::OnlyLiteralZero(&local_6c,(void *)0x0);
      bVar2 = phmap::operator==(local_6b);
      if (bVar2) {
        c.value_ = '\0';
      }
    }
  }
  uStack_c = CONCAT31(uStack_c._1_3_,c.value_);
  SVar1._4_4_ = uStack_c;
  SVar1.value = comp_local._4_4_;
  return SVar1;
}

Assistant:

SearchResult<int, true> binary_search_impl(
            const K &k, int s, int e, const CompareTo &comp,
            std::true_type /* IsCompareTo */) const {
            if (is_multi_container::value) {
                MatchKind exact_match = MatchKind::kNe;
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else {
                        e = mid;
                        if (c == 0) {
                            // Need to return the first value whose key is not less than k,
                            // which requires continuing the binary search if this is a
                            // multi-container.
                            exact_match = MatchKind::kEq;
                        }
                    }
                }
                return {s, exact_match};
            } else {  // Not a multi-container.
                while (s != e) {
                    const int mid = (s + e) >> 1;
                    const phmap::weak_ordering c = comp(key(mid), k);
                    if (c < 0) {
                        s = mid + 1;
                    } else if (c > 0) {
                        e = mid;
                    } else {
                        return {mid, MatchKind::kEq};
                    }
                }
                return {s, MatchKind::kNe};
            }
        }